

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_score.cc
# Opt level: O0

void __thiscall
xLearn::LinearScore::calc_grad_adagrad
          (LinearScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  undefined1 auVar1 [16];
  bool bVar2;
  pointer pNVar3;
  real_t *prVar4;
  uint uVar5;
  uint uVar6;
  real_t *prVar7;
  Model *in_RDX;
  long in_RDI;
  float in_XMM0_Da;
  float fVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  real_t g;
  real_t *wbg;
  real_t *wb;
  index_t idx_c;
  index_t idx_g;
  real_t gradient;
  index_t feat_id;
  const_iterator iter;
  index_t num_feat;
  real_t *w;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  float fVar11;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_38;
  index_t local_2c;
  real_t *local_28;
  float local_1c;
  Model *local_18;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_1c = in_XMM0_Da;
  local_18 = in_RDX;
  local_28 = Model::GetParameter_w(in_RDX);
  local_2c = Model::GetNumFeature(local_18);
  local_38._M_current =
       (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                         (in_stack_ffffffffffffff78);
  while( true ) {
    std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end(in_stack_ffffffffffffff78);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar2) break;
    pNVar3 = __gnu_cxx::
             __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
             ::operator->(&local_38);
    fVar11 = local_1c;
    uVar5 = pNVar3->feat_id;
    if (uVar5 < local_2c) {
      pNVar3 = __gnu_cxx::
               __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
               ::operator->(&local_38);
      uVar5 = uVar5 * 2;
      uVar6 = uVar5 + 1;
      auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_28[uVar5]),ZEXT416(*(uint *)(in_RDI + 0xc)),
                               ZEXT416((uint)(fVar11 * pNVar3->feat_val)));
      fVar8 = auVar1._0_4_;
      auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8),
                               ZEXT416((uint)local_28[uVar6]));
      local_28[uVar6] = auVar1._0_4_;
      fVar11 = *(float *)(in_RDI + 8);
      auVar9._0_4_ = InvSqrt(local_28[uVar6]);
      auVar9._4_60_ = extraout_var;
      auVar1 = vfmadd213ss_fma(auVar9._0_16_,ZEXT416((uint)-(fVar11 * fVar8)),
                               ZEXT416((uint)local_28[uVar5]));
      local_28[uVar5] = auVar1._0_4_;
    }
    __gnu_cxx::
    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
    ::operator++(&local_38);
  }
  prVar4 = Model::GetParameter_b(local_18);
  prVar7 = prVar4 + 1;
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_1c),ZEXT416((uint)local_1c),ZEXT416((uint)*prVar7));
  *prVar7 = auVar1._0_4_;
  fVar11 = *(float *)(in_RDI + 8) * local_1c;
  local_28 = prVar4;
  auVar10._0_4_ = InvSqrt(*prVar7);
  auVar10._4_60_ = extraout_var_00;
  auVar1 = vfmadd213ss_fma(auVar10._0_16_,ZEXT416((uint)-fVar11),ZEXT416((uint)*prVar4));
  *prVar4 = auVar1._0_4_;
  return;
}

Assistant:

void LinearScore::calc_grad_adagrad(const SparseRow* row,
                                    Model& model,
                                    real_t pg,
                                    real_t norm) {
  // linear term
  real_t* w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t gradient = pg * iter->feat_val;
    index_t idx_g = feat_id * 2;
    index_t idx_c = idx_g + 1;
    gradient += regu_lambda_ * w[idx_g];
    w[idx_c] += (gradient * gradient);
    w[idx_g] -= (learning_rate_ * gradient *
                 InvSqrt(w[idx_c]));
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t &wbg = w[1];
  real_t g = pg;
  wbg += g*g;
  wb -= learning_rate_ * g * InvSqrt(wbg);
}